

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O0

bool __thiscall
google::protobuf::MessageLite::ParsePartialFromFileDescriptor(MessageLite *this,int file_descriptor)

{
  bool bVar1;
  int iVar2;
  bool local_91;
  undefined1 local_70 [8];
  FileInputStream input;
  int file_descriptor_local;
  MessageLite *this_local;
  
  input.impl_._52_4_ = file_descriptor;
  io::FileInputStream::FileInputStream((FileInputStream *)local_70,file_descriptor,-1);
  bVar1 = ParsePartialFromZeroCopyStream(this,(ZeroCopyInputStream *)local_70);
  local_91 = false;
  if (bVar1) {
    iVar2 = io::FileInputStream::GetErrno((FileInputStream *)local_70);
    local_91 = iVar2 == 0;
  }
  io::FileInputStream::~FileInputStream((FileInputStream *)local_70);
  return local_91;
}

Assistant:

bool MessageLite::ParsePartialFromFileDescriptor(int file_descriptor) {
  io::FileInputStream input(file_descriptor);
  return ParsePartialFromZeroCopyStream(&input) && input.GetErrno() == 0;
}